

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  byte *pbVar1;
  Expr *pEVar2;
  long lVar3;
  LogEst LVar4;
  int iVar5;
  long in_RAX;
  Vdbe *p_00;
  int target;
  int iVar6;
  ulong x;
  short local_38;
  undefined6 uStack_36;
  int n;
  
  pEVar2 = p->pLimit;
  if (pEVar2 != (Expr *)0x0 && p->iLimit == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = target;
    p->iLimit = target;
    _local_38 = in_RAX;
    p_00 = sqlite3GetVdbe(pParse);
    iVar5 = sqlite3ExprIsInteger(pEVar2->pLeft,&n);
    lVar3 = _local_38;
    if (iVar5 == 0) {
      sqlite3ExprCode(pParse,pEVar2->pLeft,target);
      sqlite3VdbeAddOp1(p_00,0xc,target);
      sqlite3VdbeAddOp2(p_00,0x10,target,iBreak);
    }
    else {
      _local_38 = CONCAT44(n,iBreak);
      x = (ulong)(uint)n;
      sqlite3VdbeAddOp2(p_00,0x47,n,target);
      if (x == 0) {
        sqlite3VdbeGoto(p_00,_local_38);
      }
      else if (-1 < lVar3) {
        _local_38 = CONCAT62(uStack_36,p->nSelectRow);
        LVar4 = sqlite3LogEst(x);
        if (LVar4 < local_38) {
          p->nSelectRow = LVar4;
          pbVar1 = (byte *)((long)&p->selFlags + 1);
          *pbVar1 = *pbVar1 | 0x40;
        }
      }
    }
    pEVar2 = pEVar2->pRight;
    if (pEVar2 != (Expr *)0x0) {
      iVar6 = pParse->nMem;
      iVar5 = iVar6 + 1;
      p->iOffset = iVar5;
      iVar6 = iVar6 + 2;
      pParse->nMem = iVar6;
      sqlite3ExprCode(pParse,pEVar2,iVar5);
      sqlite3VdbeAddOp1(p_00,0xc,iVar5);
      sqlite3VdbeAddOp3(p_00,0xa0,target,iVar6,iVar5);
      return;
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /*
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}